

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  uint extraout_EAX;
  uint uVar41;
  uint uVar42;
  long lVar43;
  undefined1 (*pauVar44) [64];
  undefined1 (*pauVar45) [64];
  undefined1 (*pauVar46) [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  float fVar71;
  __m256 afVar72;
  undefined1 auVar73 [56];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar74 [64];
  __m128 afVar75;
  binary_op_atan2 op;
  __m256 _p1;
  __m256 _p;
  binary_op_atan2 local_d1;
  uint local_d0;
  uint local_cc;
  Mat *local_c8;
  long local_c0;
  Mat *local_b8;
  Mat *local_b0;
  long local_a8;
  __m256 local_a0;
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  uVar41 = a->c;
  local_c0 = (long)(int)uVar41;
  if (0 < local_c0) {
    local_d0 = a->h * a->w * a->d * a->elempack;
    local_cc = local_d0 & 0xfffffff0;
    local_a8 = 0;
    auVar48 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    auVar49 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
    auVar50 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    auVar51 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar52 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
    auVar53 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
    auVar54 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
    auVar55 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
    auVar56 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
    auVar57 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
    auVar58 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
    auVar59 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
    auVar60 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
    auVar61 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
    auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
    auVar47 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
    local_c8 = a;
    local_b8 = b;
    local_b0 = c;
    do {
      auVar74 = ZEXT1664(auVar47);
      pauVar46 = (undefined1 (*) [64])
                 (local_c8->cstep * local_a8 * local_c8->elemsize + (long)local_c8->data);
      pauVar44 = (undefined1 (*) [64])
                 (local_b8->cstep * local_a8 * local_b8->elemsize + (long)local_b8->data);
      pauVar45 = (undefined1 (*) [64])
                 (local_b0->cstep * local_a8 * local_b0->elemsize + (long)local_b0->data);
      if ((int)local_d0 < 0x10) {
        uVar40 = 0;
      }
      else {
        iVar39 = 0xf;
        do {
          auVar69 = *pauVar44;
          auVar70 = *pauVar46;
          auVar63 = vrcp14ps_avx512f(auVar69);
          auVar64 = vmulps_avx512f(auVar70,auVar63);
          auVar65 = vfmsub213ps_avx512f(auVar64,auVar69,auVar70);
          auVar65 = vfnmadd213ps_avx512f(auVar65,auVar63,auVar64);
          uVar35 = vcmpps_avx512f(auVar70,auVar74,1);
          auVar66 = vandps_avx512dq(auVar65,auVar50);
          auVar63._8_4_ = 0xc0490fdb;
          auVar63._0_8_ = 0xc0490fdbc0490fdb;
          auVar63._12_4_ = 0xc0490fdb;
          auVar63._16_4_ = 0xc0490fdb;
          auVar63._20_4_ = 0xc0490fdb;
          auVar63._24_4_ = 0xc0490fdb;
          auVar63._28_4_ = 0xc0490fdb;
          auVar63._32_4_ = 0xc0490fdb;
          auVar63._36_4_ = 0xc0490fdb;
          auVar63._40_4_ = 0xc0490fdb;
          auVar63._44_4_ = 0xc0490fdb;
          auVar63._48_4_ = 0xc0490fdb;
          auVar63._52_4_ = 0xc0490fdb;
          auVar63._56_4_ = 0xc0490fdb;
          auVar63._60_4_ = 0xc0490fdb;
          auVar63 = vblendmps_avx512f(auVar49,auVar63);
          bVar1 = (bool)((byte)uVar35 & 1);
          auVar67._0_4_ = (uint)bVar1 * auVar63._0_4_ | (uint)!bVar1 * auVar64._0_4_;
          bVar1 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar67._4_4_ = (uint)bVar1 * auVar63._4_4_ | (uint)!bVar1 * auVar64._4_4_;
          bVar1 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar67._8_4_ = (uint)bVar1 * auVar63._8_4_ | (uint)!bVar1 * auVar64._8_4_;
          bVar1 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar67._12_4_ = (uint)bVar1 * auVar63._12_4_ | (uint)!bVar1 * auVar64._12_4_;
          bVar1 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar67._16_4_ = (uint)bVar1 * auVar63._16_4_ | (uint)!bVar1 * auVar64._16_4_;
          bVar1 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar67._20_4_ = (uint)bVar1 * auVar63._20_4_ | (uint)!bVar1 * auVar64._20_4_;
          bVar1 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar67._24_4_ = (uint)bVar1 * auVar63._24_4_ | (uint)!bVar1 * auVar64._24_4_;
          bVar1 = (bool)((byte)(uVar35 >> 7) & 1);
          auVar67._28_4_ = (uint)bVar1 * auVar63._28_4_ | (uint)!bVar1 * auVar64._28_4_;
          bVar1 = (bool)((byte)(uVar35 >> 8) & 1);
          auVar67._32_4_ = (uint)bVar1 * auVar63._32_4_ | (uint)!bVar1 * auVar64._32_4_;
          bVar1 = (bool)((byte)(uVar35 >> 9) & 1);
          auVar67._36_4_ = (uint)bVar1 * auVar63._36_4_ | (uint)!bVar1 * auVar64._36_4_;
          bVar1 = (bool)((byte)(uVar35 >> 10) & 1);
          auVar67._40_4_ = (uint)bVar1 * auVar63._40_4_ | (uint)!bVar1 * auVar64._40_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xb) & 1);
          auVar67._44_4_ = (uint)bVar1 * auVar63._44_4_ | (uint)!bVar1 * auVar64._44_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xc) & 1);
          auVar67._48_4_ = (uint)bVar1 * auVar63._48_4_ | (uint)!bVar1 * auVar64._48_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xd) & 1);
          auVar67._52_4_ = (uint)bVar1 * auVar63._52_4_ | (uint)!bVar1 * auVar64._52_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xe) & 1);
          auVar67._56_4_ = (uint)bVar1 * auVar63._56_4_ | (uint)!bVar1 * auVar64._56_4_;
          bVar1 = SUB81(uVar35 >> 0xf,0);
          auVar67._60_4_ = (uint)bVar1 * auVar63._60_4_ | (uint)!bVar1 * auVar64._60_4_;
          uVar35 = vcmpps_avx512f(auVar51,auVar66,1);
          auVar64._8_4_ = 0xbf800000;
          auVar64._0_8_ = 0xbf800000bf800000;
          auVar64._12_4_ = 0xbf800000;
          auVar64._16_4_ = 0xbf800000;
          auVar64._20_4_ = 0xbf800000;
          auVar64._24_4_ = 0xbf800000;
          auVar64._28_4_ = 0xbf800000;
          auVar64._32_4_ = 0xbf800000;
          auVar64._36_4_ = 0xbf800000;
          auVar64._40_4_ = 0xbf800000;
          auVar64._44_4_ = 0xbf800000;
          auVar64._48_4_ = 0xbf800000;
          auVar64._52_4_ = 0xbf800000;
          auVar64._56_4_ = 0xbf800000;
          auVar64._60_4_ = 0xbf800000;
          auVar63 = vblendmps_avx512f(auVar66,auVar64);
          bVar1 = (bool)((byte)uVar35 & 1);
          auVar68._0_4_ = (uint)bVar1 * auVar63._0_4_ | (uint)!bVar1 * in_ZMM5._0_4_;
          bVar1 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar68._4_4_ = (uint)bVar1 * auVar63._4_4_ | (uint)!bVar1 * in_ZMM5._4_4_;
          bVar1 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar68._8_4_ = (uint)bVar1 * auVar63._8_4_ | (uint)!bVar1 * in_ZMM5._8_4_;
          bVar1 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar68._12_4_ = (uint)bVar1 * auVar63._12_4_ | (uint)!bVar1 * in_ZMM5._12_4_;
          bVar1 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar68._16_4_ = (uint)bVar1 * auVar63._16_4_ | (uint)!bVar1 * in_ZMM5._16_4_;
          bVar1 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar68._20_4_ = (uint)bVar1 * auVar63._20_4_ | (uint)!bVar1 * in_ZMM5._20_4_;
          bVar1 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar68._24_4_ = (uint)bVar1 * auVar63._24_4_ | (uint)!bVar1 * in_ZMM5._24_4_;
          bVar1 = (bool)((byte)(uVar35 >> 7) & 1);
          auVar68._28_4_ = (uint)bVar1 * auVar63._28_4_ | (uint)!bVar1 * in_ZMM5._28_4_;
          bVar18 = (byte)(uVar35 >> 8);
          bVar1 = (bool)(bVar18 & 1);
          auVar68._32_4_ = (uint)bVar1 * auVar63._32_4_ | (uint)!bVar1 * in_ZMM5._32_4_;
          bVar1 = (bool)((byte)(uVar35 >> 9) & 1);
          auVar68._36_4_ = (uint)bVar1 * auVar63._36_4_ | (uint)!bVar1 * in_ZMM5._36_4_;
          bVar1 = (bool)((byte)(uVar35 >> 10) & 1);
          auVar68._40_4_ = (uint)bVar1 * auVar63._40_4_ | (uint)!bVar1 * in_ZMM5._40_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xb) & 1);
          auVar68._44_4_ = (uint)bVar1 * auVar63._44_4_ | (uint)!bVar1 * in_ZMM5._44_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xc) & 1);
          auVar68._48_4_ = (uint)bVar1 * auVar63._48_4_ | (uint)!bVar1 * in_ZMM5._48_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xd) & 1);
          auVar68._52_4_ = (uint)bVar1 * auVar63._52_4_ | (uint)!bVar1 * in_ZMM5._52_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xe) & 1);
          auVar68._56_4_ = (uint)bVar1 * auVar63._56_4_ | (uint)!bVar1 * in_ZMM5._56_4_;
          bVar1 = SUB81(uVar35 >> 0xf,0);
          auVar68._60_4_ = (uint)bVar1 * auVar63._60_4_ | (uint)!bVar1 * in_ZMM5._60_4_;
          auVar63 = vmaxps_avx512f(auVar66,auVar51);
          auVar64 = vrcp14ps_avx512f(auVar63);
          auVar66 = vmulps_avx512f(auVar68,auVar64);
          uVar36 = vcmpps_avx512f(auVar69,auVar74,4);
          auVar63 = vfmsub213ps_avx512f(auVar63,auVar66,auVar68);
          auVar63 = vfnmadd213ps_avx512f(auVar63,auVar64,auVar66);
          in_ZMM5 = vmulps_avx512f(auVar63,auVar63);
          uVar37 = vcmpps_avx512f(auVar70,auVar74,4);
          auVar64 = vmulps_avx512f(in_ZMM5,in_ZMM5);
          auVar66 = vfmadd213ps_avx512f(auVar52,auVar64,auVar53);
          auVar66 = vfmadd213ps_avx512f(auVar66,auVar64,auVar54);
          auVar68 = vfmadd213ps_avx512f(auVar56,auVar64,auVar57);
          auVar68 = vfmadd213ps_avx512f(auVar68,auVar64,auVar58);
          auVar66 = vfmadd213ps_avx512f(auVar66,auVar64,auVar55);
          auVar68 = vfmadd213ps_avx512f(auVar68,auVar64,auVar59);
          auVar64 = vfmadd213ps_avx512f(auVar68,auVar64,auVar51);
          auVar64 = vfmadd231ps_avx512f(auVar64,in_ZMM5,auVar66);
          uVar38 = vcmpps_avx512f(auVar69,auVar74,1);
          auVar63 = vmulps_avx512f(auVar64,auVar63);
          auVar64 = vaddps_avx512f(auVar63,auVar60);
          bVar1 = (bool)((byte)uVar35 & 1);
          auVar66._0_4_ = (uint)bVar1 * auVar64._0_4_ | (uint)!bVar1 * auVar63._0_4_;
          bVar1 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar66._4_4_ = (uint)bVar1 * auVar64._4_4_ | (uint)!bVar1 * auVar63._4_4_;
          bVar1 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar66._8_4_ = (uint)bVar1 * auVar64._8_4_ | (uint)!bVar1 * auVar63._8_4_;
          bVar1 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar66._12_4_ = (uint)bVar1 * auVar64._12_4_ | (uint)!bVar1 * auVar63._12_4_;
          bVar1 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar66._16_4_ = (uint)bVar1 * auVar64._16_4_ | (uint)!bVar1 * auVar63._16_4_;
          bVar1 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar66._20_4_ = (uint)bVar1 * auVar64._20_4_ | (uint)!bVar1 * auVar63._20_4_;
          bVar1 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar66._24_4_ = (uint)bVar1 * auVar64._24_4_ | (uint)!bVar1 * auVar63._24_4_;
          bVar1 = (bool)((byte)(uVar35 >> 7) & 1);
          auVar66._28_4_ = (uint)bVar1 * auVar64._28_4_ | (uint)!bVar1 * auVar63._28_4_;
          bVar1 = (bool)(bVar18 & 1);
          auVar66._32_4_ = (uint)bVar1 * auVar64._32_4_ | (uint)!bVar1 * auVar63._32_4_;
          bVar1 = (bool)((byte)(uVar35 >> 9) & 1);
          auVar66._36_4_ = (uint)bVar1 * auVar64._36_4_ | (uint)!bVar1 * auVar63._36_4_;
          bVar1 = (bool)((byte)(uVar35 >> 10) & 1);
          auVar66._40_4_ = (uint)bVar1 * auVar64._40_4_ | (uint)!bVar1 * auVar63._40_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xb) & 1);
          auVar66._44_4_ = (uint)bVar1 * auVar64._44_4_ | (uint)!bVar1 * auVar63._44_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xc) & 1);
          auVar66._48_4_ = (uint)bVar1 * auVar64._48_4_ | (uint)!bVar1 * auVar63._48_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xd) & 1);
          auVar66._52_4_ = (uint)bVar1 * auVar64._52_4_ | (uint)!bVar1 * auVar63._52_4_;
          bVar1 = (bool)((byte)(uVar35 >> 0xe) & 1);
          auVar66._56_4_ = (uint)bVar1 * auVar64._56_4_ | (uint)!bVar1 * auVar63._56_4_;
          bVar1 = SUB81(uVar35 >> 0xf,0);
          auVar66._60_4_ = (uint)bVar1 * auVar64._60_4_ | (uint)!bVar1 * auVar63._60_4_;
          auVar63 = vpternlogd_avx512f(auVar66,auVar65,auVar48,0xf8);
          auVar64 = vaddps_avx512f(auVar63,auVar67);
          bVar1 = (bool)((byte)uVar38 & 1);
          bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar16 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar19 = (bool)((byte)(uVar38 >> 8) & 1);
          bVar21 = (bool)((byte)(uVar38 >> 9) & 1);
          bVar23 = (bool)((byte)(uVar38 >> 10) & 1);
          bVar25 = (bool)((byte)(uVar38 >> 0xb) & 1);
          bVar27 = (bool)((byte)(uVar38 >> 0xc) & 1);
          bVar29 = (bool)((byte)(uVar38 >> 0xd) & 1);
          bVar31 = (bool)((byte)(uVar38 >> 0xe) & 1);
          bVar33 = SUB81(uVar38 >> 0xf,0);
          auVar69 = vpternlogd_avx512f(auVar69,auVar48,auVar61,0xea);
          uVar35 = vcmpps_avx512f(auVar69,auVar74,1);
          auVar69 = vpternlogd_avx512f(auVar70,auVar48,auVar62,0xea);
          bVar2 = (bool)((byte)uVar36 & 1);
          bVar5 = (bool)((byte)(uVar36 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar36 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar36 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar36 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar36 >> 6) & 1);
          bVar17 = (bool)((byte)(uVar36 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar36 >> 8) & 1);
          bVar22 = (bool)((byte)(uVar36 >> 9) & 1);
          bVar24 = (bool)((byte)(uVar36 >> 10) & 1);
          bVar26 = (bool)((byte)(uVar36 >> 0xb) & 1);
          bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
          bVar30 = (bool)((byte)(uVar36 >> 0xd) & 1);
          bVar32 = (bool)((byte)(uVar36 >> 0xe) & 1);
          bVar34 = SUB81(uVar36 >> 0xf,0);
          bVar3 = (bool)((byte)uVar37 & 1);
          auVar70._0_4_ =
               (uint)bVar3 *
               ((uint)bVar2 * ((uint)bVar1 * auVar64._0_4_ | (uint)!bVar1 * auVar63._0_4_) |
               (uint)!bVar2 * auVar69._0_4_) |
               (uint)!bVar3 * (uint)((byte)uVar35 & 1) * auVar49._0_4_;
          bVar1 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar70._4_4_ =
               (uint)bVar1 *
               ((uint)bVar5 * ((uint)bVar4 * auVar64._4_4_ | (uint)!bVar4 * auVar63._4_4_) |
               (uint)!bVar5 * auVar69._4_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 1) & 1) * auVar49._4_4_;
          bVar1 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar70._8_4_ =
               (uint)bVar1 *
               ((uint)bVar7 * ((uint)bVar6 * auVar64._8_4_ | (uint)!bVar6 * auVar63._8_4_) |
               (uint)!bVar7 * auVar69._8_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 2) & 1) * auVar49._8_4_;
          bVar1 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar70._12_4_ =
               (uint)bVar1 *
               ((uint)bVar9 * ((uint)bVar8 * auVar64._12_4_ | (uint)!bVar8 * auVar63._12_4_) |
               (uint)!bVar9 * auVar69._12_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 3) & 1) * auVar49._12_4_;
          bVar1 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar70._16_4_ =
               (uint)bVar1 *
               ((uint)bVar11 * ((uint)bVar10 * auVar64._16_4_ | (uint)!bVar10 * auVar63._16_4_) |
               (uint)!bVar11 * auVar69._16_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 4) & 1) * auVar49._16_4_;
          bVar1 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar70._20_4_ =
               (uint)bVar1 *
               ((uint)bVar13 * ((uint)bVar12 * auVar64._20_4_ | (uint)!bVar12 * auVar63._20_4_) |
               (uint)!bVar13 * auVar69._20_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 5) & 1) * auVar49._20_4_;
          bVar1 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar70._24_4_ =
               (uint)bVar1 *
               ((uint)bVar15 * ((uint)bVar14 * auVar64._24_4_ | (uint)!bVar14 * auVar63._24_4_) |
               (uint)!bVar15 * auVar69._24_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 6) & 1) * auVar49._24_4_;
          bVar1 = (bool)((byte)(uVar37 >> 7) & 1);
          auVar70._28_4_ =
               (uint)bVar1 *
               ((uint)bVar17 * ((uint)bVar16 * auVar64._28_4_ | (uint)!bVar16 * auVar63._28_4_) |
               (uint)!bVar17 * auVar69._28_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 7) & 1) * auVar49._28_4_;
          bVar1 = (bool)((byte)(uVar37 >> 8) & 1);
          auVar70._32_4_ =
               (uint)bVar1 *
               ((uint)bVar20 * ((uint)bVar19 * auVar64._32_4_ | (uint)!bVar19 * auVar63._32_4_) |
               (uint)!bVar20 * auVar69._32_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 8) & 1) * auVar49._32_4_;
          bVar1 = (bool)((byte)(uVar37 >> 9) & 1);
          auVar70._36_4_ =
               (uint)bVar1 *
               ((uint)bVar22 * ((uint)bVar21 * auVar64._36_4_ | (uint)!bVar21 * auVar63._36_4_) |
               (uint)!bVar22 * auVar69._36_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 9) & 1) * auVar49._36_4_;
          bVar1 = (bool)((byte)(uVar37 >> 10) & 1);
          auVar70._40_4_ =
               (uint)bVar1 *
               ((uint)bVar24 * ((uint)bVar23 * auVar64._40_4_ | (uint)!bVar23 * auVar63._40_4_) |
               (uint)!bVar24 * auVar69._40_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 10) & 1) * auVar49._40_4_;
          bVar1 = (bool)((byte)(uVar37 >> 0xb) & 1);
          auVar70._44_4_ =
               (uint)bVar1 *
               ((uint)bVar26 * ((uint)bVar25 * auVar64._44_4_ | (uint)!bVar25 * auVar63._44_4_) |
               (uint)!bVar26 * auVar69._44_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 0xb) & 1) * auVar49._44_4_;
          bVar1 = (bool)((byte)(uVar37 >> 0xc) & 1);
          auVar70._48_4_ =
               (uint)bVar1 *
               ((uint)bVar28 * ((uint)bVar27 * auVar64._48_4_ | (uint)!bVar27 * auVar63._48_4_) |
               (uint)!bVar28 * auVar69._48_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 0xc) & 1) * auVar49._48_4_;
          bVar1 = (bool)((byte)(uVar37 >> 0xd) & 1);
          auVar70._52_4_ =
               (uint)bVar1 *
               ((uint)bVar30 * ((uint)bVar29 * auVar64._52_4_ | (uint)!bVar29 * auVar63._52_4_) |
               (uint)!bVar30 * auVar69._52_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 0xd) & 1) * auVar49._52_4_;
          bVar1 = (bool)((byte)(uVar37 >> 0xe) & 1);
          auVar70._56_4_ =
               (uint)bVar1 *
               ((uint)bVar32 * ((uint)bVar31 * auVar64._56_4_ | (uint)!bVar31 * auVar63._56_4_) |
               (uint)!bVar32 * auVar69._56_4_) |
               (uint)!bVar1 * (uint)((byte)(uVar35 >> 0xe) & 1) * auVar49._56_4_;
          bVar1 = SUB81(uVar37 >> 0xf,0);
          auVar70._60_4_ =
               (uint)bVar1 *
               ((uint)bVar34 * ((uint)bVar33 * auVar64._60_4_ | (uint)!bVar33 * auVar63._60_4_) |
               (uint)!bVar34 * auVar69._60_4_) |
               (uint)!bVar1 * (uint)(byte)(uVar35 >> 0xf) * auVar49._60_4_;
          pauVar46 = pauVar46 + 1;
          *pauVar45 = auVar70;
          pauVar44 = pauVar44 + 1;
          pauVar45 = pauVar45 + 1;
          iVar39 = iVar39 + 0x10;
          uVar40 = local_cc;
        } while (iVar39 < (int)local_d0);
      }
      uVar41 = uVar40;
      if ((int)(uVar40 | 7) < (int)local_d0) {
        do {
          local_80 = *(float (*) [2])*pauVar46;
          afStack_78 = *(float (*) [2])(*pauVar46 + 8);
          afStack_70 = *(float (*) [2])(*pauVar46 + 0x10);
          afStack_68._0_8_ = *(undefined8 *)(*pauVar46 + 0x18);
          local_a0 = *(__m256 *)*pauVar44;
          afVar72 = local_a0;
          BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                    (&local_d1,(__m256 *)local_80,&local_a0);
          *(__m256 *)*pauVar45 = afVar72;
          pauVar46 = (undefined1 (*) [64])(*pauVar46 + 0x20);
          pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
          pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
          uVar40 = uVar41 + 8;
          iVar39 = uVar41 + 0xf;
          uVar41 = uVar40;
        } while (iVar39 < (int)local_d0);
      }
      uVar42 = uVar40;
      uVar41 = uVar40 | 3;
      if ((int)(uVar40 | 3) < (int)local_d0) {
        do {
          local_80 = *(float (*) [2])*pauVar46;
          afStack_78 = *(float (*) [2])(*pauVar46 + 8);
          local_a0._0_16_ = *(undefined1 (*) [16])*pauVar44;
          auVar73 = ZEXT856(*(ulong *)(*pauVar44 + 8));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          afVar75 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                              (&local_d1,(__m128 *)local_80,(__m128 *)local_a0);
          auVar48._0_8_ = afVar75._0_8_;
          auVar48._8_56_ = auVar73;
          *(undefined1 (*) [16])*pauVar45 = auVar48._0_16_;
          pauVar46 = (undefined1 (*) [64])(*pauVar46 + 0x10);
          pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
          pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x10);
          uVar40 = uVar42 + 4;
          iVar39 = uVar42 + 7;
          uVar42 = uVar40;
          uVar41 = uVar40;
        } while (iVar39 < (int)local_d0);
      }
      auVar47 = auVar74._0_16_;
      iVar39 = local_d0 - uVar40;
      if ((int)uVar40 < (int)local_d0) {
        lVar43 = 0;
        do {
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          fVar71 = atan2f(*(float *)(*pauVar46 + lVar43 * 4),*(float *)(*pauVar44 + lVar43 * 4));
          auVar47 = auVar74._0_16_;
          *(float *)((long)*pauVar45 + lVar43 * 4) = fVar71;
          lVar43 = lVar43 + 1;
          uVar41 = extraout_EAX;
        } while (iVar39 != (int)lVar43);
      }
      local_a8 = local_a8 + 1;
      auVar48 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar49 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar50 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar51 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar52 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar53 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar54 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar55 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar56 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar60 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar61 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar62 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar47 = vxorps_avx512vl(auVar47,auVar47);
    } while (local_a8 != local_c0);
  }
  return uVar41;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}